

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O2

void __thiscall SymbolTable::Print(SymbolTable *this,ofstream *out)

{
  ostream *poVar1;
  __node_base *p_Var2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>
  elem;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>
  local_60;
  
  p_Var2 = &(this->classes)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>
    ::pair(&local_60,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>
            *)(p_Var2 + 1));
    poVar1 = std::operator<<((ostream *)out,"class: {");
    std::operator<<(poVar1,"\n");
    ClassInfo::Print(local_60.second.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,out);
    poVar1 = std::operator<<((ostream *)out,"}");
    std::operator<<(poVar1,"\n");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>
    ::~pair(&local_60);
  }
  return;
}

Assistant:

void SymbolTable::Print( std::ofstream& out )
{
	for( auto elem : classes ) {
		out << "class: {" << "\n";
		(elem.second)->Print( out );
		out << "}" << "\n";
	}
}